

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall
cmCTest::HandleCommandLineArguments
          (cmCTest *this,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errormsg)

{
  undefined1 *__n;
  size_type sVar1;
  pointer pbVar2;
  pointer pcVar3;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var4;
  bool bVar5;
  int iVar6;
  Repeat RVar7;
  int iVar8;
  size_t sVar9;
  undefined8 *puVar10;
  char *pcVar11;
  ostream *poVar12;
  void *__s1;
  undefined8 uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  char *in_R8;
  size_type __rlen;
  cmDuration cVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view varg1;
  string_view varg1_00;
  string_view varg1_01;
  string_view varg1_02;
  string_view varg1_03;
  string_view varg1_04;
  string_view varg1_05;
  string_view varg1_06;
  string_view varg1_07;
  string_view varg1_08;
  string_view varg1_09;
  string_view varg1_10;
  string_view varg1_11;
  string_view varg1_12;
  string_view varg1_13;
  string_view varg1_14;
  string_view varg1_15;
  string_view varg1_16;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  string arg;
  string format;
  long outputSize;
  RegularExpression repeatRegex;
  unsigned_long n;
  cmCTest local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  long local_238 [2];
  undefined1 local_228 [48];
  undefined1 local_1f8 [48];
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  char *local_1a8;
  pointer local_1a0;
  char *local_170;
  char *local_168;
  ios_base local_158 [64];
  char *local_118;
  char *local_108;
  int local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_248.Impl._M_t.
  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
  super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl =
       (unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>)local_238;
  pcVar3 = pbVar2[*i]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar3,pcVar3 + pbVar2[*i]._M_string_length);
  if ((local_240 !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x2) ||
     (*(short *)local_248.Impl._M_t.
                super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t
                .super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl != 0x462d)) {
    varg1._M_str = "--parallel";
    varg1._M_len = (size_t)"-j";
    bVar5 = CheckArgument(&local_248,(string *)0x2,varg1,in_R8);
    if (bVar5) {
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
        sVar9 = *i + 1;
        *i = sVar9;
        iVar6 = atoi(pbVar2[sVar9]._M_dataplus._M_p);
        iVar8 = 1;
        if (1 < iVar6) {
          iVar8 = iVar6;
        }
        _Var4._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        (_Var4._M_head_impl)->ParallelLevel = iVar8;
        (_Var4._M_head_impl)->ParallelLevelSetInCli = true;
        goto LAB_00534dfc;
      }
    }
    local_1c8._0_8_ = local_240;
    local_1c8._8_8_ =
         local_248.Impl._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    __str._M_str = "-j";
    __str._M_len = 2;
    pcVar11 = "-j";
    iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,0,2,__str);
    if (iVar8 == 0) {
      std::__cxx11::string::substr((ulong)local_1c8,(ulong)&local_248);
      uVar13 = local_1c8._0_8_;
      iVar8 = atoi((char *)local_1c8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar13 != &local_1b8) {
        operator_delete((void *)uVar13,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      iVar6 = 1;
      if (1 < iVar8) {
        iVar6 = iVar8;
      }
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      (_Var4._M_head_impl)->ParallelLevel = iVar6;
      (_Var4._M_head_impl)->ParallelLevelSetInCli = true;
      goto LAB_00534dfc;
    }
    switch(local_240) {
    case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x8:
      if (*(long *)local_248.Impl._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl !=
          0x7461657065722d2d) break;
      if (((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= *i) {
        pcVar11 = "\'--repeat\' requires an argument";
        goto LAB_00534026;
      }
      if (((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatMode != Never) {
        pcVar11 = "At most one \'--repeat\' option may be used.";
        goto LAB_00533a27;
      }
      *i = *i + 1;
      local_118 = (char *)0x0;
      local_108 = (char *)0x0;
      local_100 = 0;
      memset((RegularExpression *)local_1c8,0,0xaa);
      cmsys::RegularExpression::compile
                ((RegularExpression *)local_1c8,"^(until-fail|until-pass|after-timeout):([0-9]+)$");
      bVar5 = cmsys::RegularExpression::find
                        ((RegularExpression *)local_1c8,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p,
                         (RegularExpressionMatch *)local_1c8);
      if (bVar5) {
        if ((undefined1 *)local_1b8._M_allocated_capacity == (undefined1 *)0x0) {
          local_228._0_8_ = local_228 + 0x10;
          local_228._8_8_ = (pointer)0x0;
          local_228[0x10] = '\0';
        }
        else {
          local_228._0_8_ = local_228 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,local_1b8._M_allocated_capacity,local_168);
        }
        local_50._M_dataplus._M_p = (pointer)0x1;
        cmStrToULong((string *)local_228,(unsigned_long *)&local_50);
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatCount =
             (int)local_50._M_dataplus._M_p;
        if (1 < (int)local_50._M_dataplus._M_p) {
          if ((Private *)local_1c8._8_8_ == (Private *)0x0) {
            local_1f8._0_8_ = local_1f8 + 0x10;
            local_1f8._8_8_ = (pointer)0x0;
            local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
          }
          else {
            local_1f8._0_8_ = local_1f8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f8,local_1c8._8_8_,local_170);
          }
          iVar8 = std::__cxx11::string::compare(local_1f8);
          if (iVar8 == 0) {
            RVar7 = UntilFail;
LAB_00534d9f:
            ((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatMode = RVar7;
          }
          else {
            iVar8 = std::__cxx11::string::compare(local_1f8);
            if (iVar8 == 0) {
              RVar7 = UntilPass;
              goto LAB_00534d9f;
            }
            iVar8 = std::__cxx11::string::compare(local_1f8);
            if (iVar8 == 0) {
              RVar7 = AfterTimeout;
              goto LAB_00534d9f;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1f8 + 0x10)) {
            operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
          }
        }
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
        }
      }
      else {
        local_228._0_8_ = (char *)0x20;
        local_228._8_8_ = "\'--repeat\' given invalid value \'";
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1f8._8_8_ = pbVar2[*i]._M_dataplus._M_p;
        local_1f8._0_8_ = pbVar2[*i]._M_string_length;
        cmStrCat<char[2]>(&local_50,(cmAlphaNum *)local_228,(cmAlphaNum *)local_1f8,
                          (char (*) [2])0x7cd5a4);
        std::__cxx11::string::operator=((string *)errormsg,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_108 != (char *)0x0) {
        operator_delete__(local_108);
      }
      if (bVar5) goto LAB_00534dfc;
      goto LAB_005353fd;
    case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x9:
      if (*(char *)&(((string *)
                     ((long)local_248.Impl._M_t.
                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                            .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 8))->
                    _M_dataplus)._M_p == '0' &&
          *(long *)local_248.Impl._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
          0x2e31707474682d2d) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->UseHTTP10 = true;
        goto LAB_00534dfc;
      }
      if (*(char *)&(((string *)
                     ((long)local_248.Impl._M_t.
                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                            .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 8))->
                    _M_dataplus)._M_p == 't' &&
          *(long *)local_248.Impl._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
          0x756f656d69742d2d) {
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
          sVar9 = *i + 1;
          *i = sVar9;
          cVar15.__r = atof(pbVar2[sVar9]._M_dataplus._M_p);
          (((this->Impl)._M_t.
            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
            super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->GlobalTimeout).__r =
               cVar15.__r;
          goto LAB_00534dfc;
        }
      }
      break;
    case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0xb:
      if (*(long *)((long)local_248.Impl._M_t.
                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                          .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 3) !=
          0x64616f6c2d747365 ||
          *(long *)local_248.Impl._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl !=
          0x6c2d747365742d2d) {
LAB_00533cbe:
        if (*(long *)((long)local_248.Impl._M_t.
                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                            .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 3) ==
            0x656d69742d706f74 &&
            *(long *)local_248.Impl._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
            0x742d706f74732d2d) {
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
            sVar9 = *i + 1;
            *i = sVar9;
            SetStopTime(this,pbVar2 + sVar9);
            goto LAB_00534dfc;
          }
        }
        break;
      }
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U <= *i)
      goto LAB_00533cbe;
      sVar9 = *i + 1;
      *i = sVar9;
      bVar5 = cmStrToULong(pbVar2 + sVar9,(unsigned_long *)local_1f8);
      if (bVar5) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestLoad = local_1f8._0_8_;
        goto LAB_00534dfc;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Invalid value for \'Test Load\' : ",0x20);
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8,pbVar2[*i]._M_dataplus._M_p,
                           pbVar2[*i]._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar12);
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x7a2,(char *)local_228._0_8_,false);
      goto LAB_005340bd;
    case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0xe:
      if (*(long *)((long)local_248.Impl._M_t.
                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                          .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 6) ==
          0x736c6562616c2d74 &&
          *(long *)local_248.Impl._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
          0x2d746e6972702d2d) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->PrintLabels = true;
        goto LAB_00534dfc;
      }
      break;
    case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x11:
      auVar18[0] = -(*(char *)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl == '-')
      ;
      auVar18[1] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 1) == '-');
      auVar18[2] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 2) == 's');
      auVar18[3] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 3) == 't');
      auVar18[4] = -(*(undefined1 *)
                      ((long)local_248.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4) ==
                    'o');
      auVar18[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 5) == 'p');
      auVar18[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 6) == '-');
      auVar18[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 7) == 'o');
      auVar18[8] = -(*(char *)&(((string *)
                                ((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 8))->_M_dataplus)._M_p == 'n');
      auVar18[9] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 9) == '-');
      auVar18[10] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 10) == 'f');
      auVar18[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xb) == 'a');
      auVar18[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xc) == 'i');
      auVar18[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xd) == 'l');
      auVar18[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xe) == 'u');
      auVar18[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xf) == 'r');
      auVar30[0] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0x10) == 'e');
      auVar30[1] = 0xff;
      auVar30[2] = 0xff;
      auVar30[3] = 0xff;
      auVar30[4] = 0xff;
      auVar30[5] = 0xff;
      auVar30[6] = 0xff;
      auVar30[7] = 0xff;
      auVar30[8] = 0xff;
      auVar30[9] = 0xff;
      auVar30[10] = 0xff;
      auVar30[0xb] = 0xff;
      auVar30[0xc] = 0xff;
      auVar30[0xd] = 0xff;
      auVar30[0xe] = 0xff;
      auVar30[0xf] = 0xff;
      auVar30 = auVar30 & auVar18;
      if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->StopOnFailure = true;
        goto LAB_00534dfc;
      }
      break;
    case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x13:
      auVar28[0] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 3) == 'e');
      auVar28[1] = -(*(undefined1 *)
                      ((long)local_248.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4) ==
                    'p');
      auVar28[2] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 5) == 'e');
      auVar28[3] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 6) == 'a');
      auVar28[4] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 7) == 't');
      auVar28[5] = -(*(char *)&(((string *)
                                ((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 8))->_M_dataplus)._M_p == '-');
      auVar28[6] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 9) == 'u');
      auVar28[7] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 10) == 'n');
      auVar28[8] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0xb) == 't');
      auVar28[9] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0xc) == 'i');
      auVar28[10] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 0xd) == 'l');
      auVar28[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xe) == '-');
      auVar28[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xf) == 'f');
      auVar28[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x10) == 'a');
      auVar28[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x11) == 'i');
      auVar28[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x12) == 'l');
      auVar16[0] = -(*(char *)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl == '-')
      ;
      auVar16[1] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 1) == '-');
      auVar16[2] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 2) == 'r');
      auVar16[3] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 3) == 'e');
      auVar16[4] = -(*(undefined1 *)
                      ((long)local_248.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4) ==
                    'p');
      auVar16[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 5) == 'e');
      auVar16[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 6) == 'a');
      auVar16[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 7) == 't');
      auVar16[8] = -(*(char *)&(((string *)
                                ((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 8))->_M_dataplus)._M_p == '-');
      auVar16[9] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 9) == 'u');
      auVar16[10] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 10) == 'n');
      auVar16[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xb) == 't');
      auVar16[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xc) == 'i');
      auVar16[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xd) == 'l');
      auVar16[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xe) == '-');
      auVar16[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xf) == 'f');
      auVar16 = auVar16 & auVar28;
      if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) break;
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U <= *i) {
        pcVar11 = "\'--repeat-until-fail\' requires an argument";
LAB_00534026:
        bVar5 = false;
        std::__cxx11::string::_M_replace
                  ((ulong)errormsg,0,(char *)errormsg->_M_string_length,(ulong)pcVar11);
        goto LAB_0053583b;
      }
      if (((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatMode != Never) {
        pcVar11 = "At most one \'--repeat\' option may be used.";
        goto LAB_00534026;
      }
      sVar9 = *i + 1;
      *i = sVar9;
      local_50._M_dataplus._M_p = (pointer)0x1;
      bVar5 = cmStrToLong(pbVar2 + sVar9,(long *)&local_50);
      if (bVar5) {
        _Var4._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        (_Var4._M_head_impl)->RepeatCount = (int)local_50._M_dataplus._M_p;
        if (1 < (long)local_50._M_dataplus._M_p) {
          (_Var4._M_head_impl)->RepeatMode = UntilFail;
        }
        goto LAB_00534dfc;
      }
      local_1c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x2f;
      local_1c8._8_8_ = "\'--repeat-until-fail\' given non-integer value \'";
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_228._8_8_ = pbVar2[*i]._M_dataplus._M_p;
      local_228._0_8_ = pbVar2[*i]._M_string_length;
      cmStrCat<char[2]>((string *)local_1f8,(cmAlphaNum *)local_1c8,(cmAlphaNum *)local_228,
                        (char (*) [2])0x7cd5a4);
      goto LAB_005353d3;
    case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x14:
      iVar8 = *(int *)((long)local_248.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x10);
      auVar29[0] = -((char)iVar8 == 't');
      auVar29[1] = -((char)((uint)iVar8 >> 8) == 'p');
      auVar29[2] = -((char)((uint)iVar8 >> 0x10) == 'u');
      auVar29[3] = -((char)((uint)iVar8 >> 0x18) == 't');
      auVar29[4] = 0xff;
      auVar29[5] = 0xff;
      auVar29[6] = 0xff;
      auVar29[7] = 0xff;
      auVar29[8] = 0xff;
      auVar29[9] = 0xff;
      auVar29[10] = 0xff;
      auVar29[0xb] = 0xff;
      auVar29[0xc] = 0xff;
      auVar29[0xd] = 0xff;
      auVar29[0xe] = 0xff;
      auVar29[0xf] = 0xff;
      auVar17[0] = -(*(char *)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl == '-')
      ;
      auVar17[1] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 1) == '-');
      auVar17[2] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 2) == 'n');
      auVar17[3] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 3) == 'o');
      auVar17[4] = -(*(undefined1 *)
                      ((long)local_248.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4) ==
                    '-');
      auVar17[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 5) == 'c');
      auVar17[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 6) == 'o');
      auVar17[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 7) == 'm');
      auVar17[8] = -(*(char *)&(((string *)
                                ((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 8))->_M_dataplus)._M_p == 'p');
      auVar17[9] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 9) == 'r');
      auVar17[10] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 10) == 'e');
      auVar17[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xb) == 's');
      auVar17[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xc) == 's');
      auVar17[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xd) == '-');
      auVar17[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xe) == 'o');
      auVar17[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xf) == 'u');
      auVar17 = auVar17 & auVar29;
      if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->CompressTestOutput = false;
        goto LAB_00534dfc;
      }
    }
    varg1_00._M_str = "--build-config";
    varg1_00._M_len = (size_t)"-C";
    bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_00,pcVar11);
    if (bVar5) {
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
        sVar9 = *i + 1;
        *i = sVar9;
        SetConfigType(this,pbVar2 + sVar9);
        goto LAB_00534dfc;
      }
    }
    if ((long)local_240 < 0x13) {
      if (local_240 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x7) {
        if (*(int *)((long)local_248.Impl._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 3) ==
            0x67756265 &&
            *(int *)local_248.Impl._M_t.
                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl == 0x65642d2d) {
          _Var4._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          (_Var4._M_head_impl)->Debug = true;
          (_Var4._M_head_impl)->ShowLineNumbers = true;
        }
        else {
          if (((*(int *)((long)local_248.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 3)
                != 0x70756f72 ||
                *(int *)local_248.Impl._M_t.
                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                        .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl != 0x72672d2d
               ) && (*(int *)((long)local_248.Impl._M_t.
                                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl +
                             3) != 0x6b636172 ||
                     *(int *)local_248.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl !=
                     0x72742d2d)) ||
             (((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= *i))
          goto LAB_00533eb4;
          *i = *i + 1;
          std::__cxx11::string::_M_assign
                    ((string *)
                     &((this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                      SpecificGroup);
        }
      }
      else {
        if ((local_240 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x12) ||
           (auVar19[0] = -(*(char *)local_248.Impl._M_t.
                                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                          == '-'),
           auVar19[1] = -(*(char *)((long)local_248.Impl._M_t.
                                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                          .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                          _M_head_impl + 1) == '-'),
           auVar19[2] = -(*(char *)((long)local_248.Impl._M_t.
                                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                          .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                          _M_head_impl + 2) == 'n'),
           auVar19[3] = -(*(char *)((long)local_248.Impl._M_t.
                                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                          .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                          _M_head_impl + 3) == 'o'),
           auVar19[4] = -(*(undefined1 *)
                           ((long)local_248.Impl._M_t.
                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4
                           ) == '-'),
           auVar19[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                          .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                          _M_head_impl + 5) == 'l'),
           auVar19[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                          .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                          _M_head_impl + 6) == 'a'),
           auVar19[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                          .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                          _M_head_impl + 7) == 'b'),
           auVar19[8] = -(*(char *)&(((string *)
                                     ((long)local_248.Impl._M_t.
                                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                            .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                            _M_head_impl + 8))->_M_dataplus)._M_p == 'e'),
           auVar19[9] = -(*(char *)((long)local_248.Impl._M_t.
                                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                          .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                          _M_head_impl + 9) == 'l'),
           auVar19[10] = -(*(char *)((long)local_248.Impl._M_t.
                                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                           .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                           _M_head_impl + 10) == '-'),
           auVar19[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                            .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                            _M_head_impl + 0xb) == 's'),
           auVar19[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                            .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                            _M_head_impl + 0xc) == 'u'),
           auVar19[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                            .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                            _M_head_impl + 0xd) == 'm'),
           auVar19[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                            .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                            _M_head_impl + 0xe) == 'm'),
           auVar19[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                            .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                            _M_head_impl + 0xf) == 'a'),
           auVar31[0] = -((char)*(short *)((long)local_248.Impl._M_t.
                                                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                 .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                 _M_head_impl + 0x10) == 'r'),
           auVar31[1] = -((char)((ushort)*(short *)((long)local_248.Impl._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 0x10) >> 8) == 'y'),
           auVar31[2] = 0xff, auVar31[3] = 0xff, auVar31[4] = 0xff, auVar31[5] = 0xff,
           auVar31[6] = 0xff, auVar31[7] = 0xff, auVar31[8] = 0xff, auVar31[9] = 0xff,
           auVar31[10] = 0xff, auVar31[0xb] = 0xff, auVar31[0xc] = 0xff, auVar31[0xd] = 0xff,
           auVar31[0xe] = 0xff, auVar31[0xf] = 0xff, auVar31 = auVar31 & auVar19,
           (ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_00533eb4;
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->LabelSummary = false;
      }
      goto LAB_00534dfc;
    }
    if (local_240 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x13) {
      auVar33[0] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 3) == 'h');
      auVar33[1] = -(*(undefined1 *)
                      ((long)local_248.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4) ==
                    'o');
      auVar33[2] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 5) == 'w');
      auVar33[3] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 6) == '-');
      auVar33[4] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 7) == 'l');
      auVar33[5] = -(*(char *)&(((string *)
                                ((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 8))->_M_dataplus)._M_p == 'i');
      auVar33[6] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 9) == 'n');
      auVar33[7] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 10) == 'e');
      auVar33[8] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0xb) == '-');
      auVar33[9] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0xc) == 'n');
      auVar33[10] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 0xd) == 'u');
      auVar33[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xe) == 'm');
      auVar33[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xf) == 'b');
      auVar33[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x10) == 'e');
      auVar33[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x11) == 'r');
      auVar33[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x12) == 's');
      auVar21[0] = -(*(char *)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl == '-')
      ;
      auVar21[1] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 1) == '-');
      auVar21[2] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 2) == 's');
      auVar21[3] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 3) == 'h');
      auVar21[4] = -(*(undefined1 *)
                      ((long)local_248.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4) ==
                    'o');
      auVar21[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 5) == 'w');
      auVar21[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 6) == '-');
      auVar21[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 7) == 'l');
      auVar21[8] = -(*(char *)&(((string *)
                                ((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 8))->_M_dataplus)._M_p == 'i');
      auVar21[9] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 9) == 'n');
      auVar21[10] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 10) == 'e');
      auVar21[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xb) == '-');
      auVar21[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xc) == 'n');
      auVar21[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xd) == 'u');
      auVar21[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xe) == 'm');
      auVar21[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xf) == 'b');
      auVar21 = auVar21 & auVar33;
      if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00533eb4;
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ShowLineNumbers = true;
      goto LAB_00534dfc;
    }
    if ((local_240 ==
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x17) &&
       (auVar32[0] = -(*(byte *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 7) == 'b'),
       auVar32[1] = -(*(char *)&(((string *)
                                 ((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 8))->_M_dataplus)._M_p == 'p'),
       auVar32[2] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 9) == 'r'),
       auVar32[3] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 10) == 'o'),
       auVar32[4] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 0xb) == 'j'),
       auVar32[5] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 0xc) == 'e'),
       auVar32[6] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 0xd) == 'c'),
       auVar32[7] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 0xe) == 't'),
       auVar32[8] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 0xf) == '-'),
       auVar32[9] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 0x10) == 's'),
       auVar32[10] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x11) == 'u'),
       auVar32[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0x12) == 'm'),
       auVar32[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0x13) == 'm'),
       auVar32[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0x14) == 'a'),
       auVar32[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0x15) == 'r'),
       auVar32[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0x16) == 'y'),
       auVar20[0] = -(*(char *)local_248.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl == '-'
                     ),
       auVar20[1] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 1) == '-'),
       auVar20[2] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 2) == 'n'),
       auVar20[3] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 3) == 'o'),
       auVar20[4] = -(*(undefined1 *)
                       ((long)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4) ==
                     '-'),
       auVar20[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 5) == 's'),
       auVar20[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 6) == 'u'),
       auVar20[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 7) == 'b'),
       auVar20[8] = -(*(char *)&(((string *)
                                 ((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 8))->_M_dataplus)._M_p == 'p'),
       auVar20[9] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 9) == 'r'),
       auVar20[10] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 10) == 'o'),
       auVar20[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xb) == 'j'),
       auVar20[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xc) == 'e'),
       auVar20[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xd) == 'c'),
       auVar20[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xe) == 't'),
       auVar20[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xf) == '-'), auVar20 = auVar20 & auVar32,
       (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff)) {
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->SubprojectSummary = false;
      goto LAB_00534dfc;
    }
LAB_00533eb4:
    varg1_01._M_str = "--quiet";
    varg1_01._M_len = (size_t)"-Q";
    bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_01,pcVar11);
    if (bVar5) {
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Quiet = true;
      goto LAB_00534dfc;
    }
    if ((local_240 ==
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0xa) &&
       (*(short *)&(((string *)
                    ((long)local_248.Impl._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 8))->
                   _M_dataplus)._M_p == 0x7373 &&
        *(long *)local_248.Impl._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl == 0x6572676f72702d2d
       )) {
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestProgressOutput = true;
      goto LAB_00534dfc;
    }
    varg1_02._M_str = "--verbose";
    varg1_02._M_len = (size_t)"-V";
    bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_02,pcVar11);
    if (bVar5) {
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Verbose = true;
      goto LAB_00534dfc;
    }
    varg1_03._M_str = "--extra-verbose";
    varg1_03._M_len = (size_t)"-VV";
    bVar5 = CheckArgument(&local_248,(string *)0x3,varg1_03,pcVar11);
    if (bVar5) {
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      (_Var4._M_head_impl)->Verbose = true;
      (_Var4._M_head_impl)->ExtraVerbose = true;
      goto LAB_00534dfc;
    }
    if (local_240 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x19) {
      auVar36[0] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 9) == 't');
      auVar36[1] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 10) == 'p');
      auVar36[2] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0xb) == 'u');
      auVar36[3] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0xc) == 't');
      auVar36[4] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0xd) == '-');
      auVar36[5] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0xe) == 's');
      auVar36[6] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0xf) == 'i');
      auVar36[7] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0x10) == 'z');
      auVar36[8] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0x11) == 'e');
      auVar36[9] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 0x12) == '-');
      auVar36[10] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 0x13) == 'p');
      auVar36[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x14) == 'a');
      auVar36[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x15) == 's');
      auVar36[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x16) == 's');
      auVar36[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x17) == 'e');
      auVar36[0xf] = -(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_248.Impl._M_t.
                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl +
                           0x18))->_M_local_buf[0] == 'd');
      auVar24[0] = -(*(char *)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl == '-')
      ;
      auVar24[1] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 1) == '-');
      auVar24[2] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 2) == 't');
      auVar24[3] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 3) == 'e');
      auVar24[4] = -(*(undefined1 *)
                      ((long)local_248.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4) ==
                    's');
      auVar24[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 5) == 't');
      auVar24[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 6) == '-');
      auVar24[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 7) == 'o');
      auVar24[8] = -(*(char *)&(((string *)
                                ((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 8))->_M_dataplus)._M_p == 'u');
      auVar24[9] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 9) == 't');
      auVar24[10] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 10) == 'p');
      auVar24[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xb) == 'u');
      auVar24[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xc) == 't');
      auVar24[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xd) == '-');
      auVar24[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xe) == 's');
      auVar24[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xf) == 'i');
      auVar24 = auVar24 & auVar36;
      if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff) {
LAB_0053431a:
        auVar41[0] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 9) == 't');
        auVar41[1] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 10) == 'p');
        auVar41[2] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xb) == 'u');
        auVar41[3] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xc) == 't');
        auVar41[4] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xd) == '-');
        auVar41[5] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xe) == 's');
        auVar41[6] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xf) == 'i');
        auVar41[7] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x10) == 'z');
        auVar41[8] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x11) == 'e');
        auVar41[9] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x12) == '-');
        auVar41[10] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0x13) == 'f');
        auVar41[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0x14) == 'a');
        auVar41[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0x15) == 'i');
        auVar41[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0x16) == 'l');
        auVar41[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0x17) == 'e');
        auVar41[0xf] = -(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)local_248.Impl._M_t.
                                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl +
                             0x18))->_M_local_buf[0] == 'd');
        auVar37[0] = -(*(char *)local_248.Impl._M_t.
                                super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
                      '-');
        auVar37[1] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 1) == '-');
        auVar37[2] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 2) == 't');
        auVar37[3] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 3) == 'e');
        auVar37[4] = -(*(undefined1 *)
                        ((long)local_248.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4)
                      == 0x73);
        auVar37[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 5) == 0x74);
        auVar37[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 6) == 0x2d);
        auVar37[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 7) == 0x6f);
        auVar37[8] = -(*(char *)&(((string *)
                                  ((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 8))->_M_dataplus)._M_p == 'u');
        auVar37[9] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 9) == 't');
        auVar37[10] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 10) == 'p');
        auVar37[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0xb) == 'u');
        auVar37[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0xc) == 't');
        auVar37[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0xd) == '-');
        auVar37[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0xe) == 's');
        auVar37[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0xf) == 'i');
        auVar41 = auVar41 & auVar37;
        if ((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) == 0xffff) {
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
            sVar9 = *i + 1;
            *i = sVar9;
            bVar5 = cmStrToLong(pbVar2 + sVar9,(long *)local_1f8);
            if (bVar5) {
              *(undefined4 *)
               ((long)&((this->Impl)._M_t.
                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                        .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestHandler
               + 0x1b0) = local_1f8._0_4_;
              goto LAB_00534dfc;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,"Invalid value for \'--test-output-size-failed\': ",0x2f
                      );
            pbVar2 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1c8,pbVar2[*i]._M_dataplus._M_p,
                                 pbVar2[*i]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            std::__cxx11::stringbuf::str();
            Log(this,6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0x7f8,(char *)local_228._0_8_,false);
            goto LAB_005340bd;
          }
        }
        goto LAB_005343ab;
      }
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U <= *i)
      goto LAB_0053431a;
      sVar9 = *i + 1;
      *i = sVar9;
      bVar5 = cmStrToLong(pbVar2 + sVar9,(long *)local_1f8);
      if (bVar5) {
        *(undefined4 *)
         ((long)&((this->Impl)._M_t.
                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                  .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestHandler +
         0x1ac) = local_1f8._0_4_;
        goto LAB_00534dfc;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Invalid value for \'--test-output-size-passed\': ",0x2f);
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8,pbVar2[*i]._M_dataplus._M_p,
                           pbVar2[*i]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x7ec,(char *)local_228._0_8_,false);
LAB_005340bd:
      if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
        operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      goto LAB_00534dfc;
    }
    if (local_240 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x18) {
      sVar1 = *(size_type *)
               ((long)local_248.Impl._M_t.
                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x10);
      auVar35[0] = -((char)sVar1 == 'u');
      auVar35[1] = -((char)(sVar1 >> 8) == 'n');
      auVar35[2] = -((char)(sVar1 >> 0x10) == 'c');
      auVar35[3] = -((char)(sVar1 >> 0x18) == 'a');
      auVar35[4] = -((char)(sVar1 >> 0x20) == 't');
      auVar35[5] = -((char)(sVar1 >> 0x28) == 'i');
      auVar35[6] = -((char)(sVar1 >> 0x30) == 'o');
      auVar35[7] = -((char)(sVar1 >> 0x38) == 'n');
      auVar35[8] = 0xff;
      auVar35[9] = 0xff;
      auVar35[10] = 0xff;
      auVar35[0xb] = 0xff;
      auVar35[0xc] = 0xff;
      auVar35[0xd] = 0xff;
      auVar35[0xe] = 0xff;
      auVar35[0xf] = 0xff;
      auVar23[0] = -(*(char *)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl == '-')
      ;
      auVar23[1] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 1) == '-');
      auVar23[2] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 2) == 't');
      auVar23[3] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 3) == 'e');
      auVar23[4] = -(*(undefined1 *)
                      ((long)local_248.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4) ==
                    's');
      auVar23[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 5) == 't');
      auVar23[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 6) == '-');
      auVar23[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 7) == 'o');
      auVar23[8] = -(*(char *)&(((string *)
                                ((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 8))->_M_dataplus)._M_p == 'u');
      auVar23[9] = -(*(char *)((long)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                              + 9) == 't');
      auVar23[10] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 10) == 'p');
      auVar23[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xb) == 'u');
      auVar23[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xc) == 't');
      auVar23[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xd) == '-');
      auVar23[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xe) == 't');
      auVar23[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xf) == 'r');
      auVar23 = auVar23 & auVar35;
      if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) goto LAB_005343ab;
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U <= *i)
      goto LAB_005343ab;
      sVar9 = *i + 1;
      *i = sVar9;
      bVar5 = cmCTestTestHandler::SetTestOutputTruncation
                        (&((this->Impl)._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                          TestHandler,pbVar2 + sVar9);
      if (bVar5) goto LAB_00534dfc;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     "Invalid value for \'--test-output-truncation\': ",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + *i);
      std::__cxx11::string::operator=((string *)errormsg,(string *)local_1c8);
      uVar13 = local_1b8._M_allocated_capacity;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ == &local_1b8) goto LAB_005353fd;
      goto LAB_005353f5;
    }
    if ((local_240 ==
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x13) &&
       (auVar34[0] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 3) == 'u'),
       auVar34[1] = -(*(undefined1 *)
                       ((long)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4) ==
                     't'),
       auVar34[2] = -(*(byte *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 5) == 'p'),
       auVar34[3] = -(*(byte *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 6) == 'u'),
       auVar34[4] = -(*(byte *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 7) == 't'),
       auVar34[5] = -(*(char *)&(((string *)
                                 ((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 8))->_M_dataplus)._M_p == '-'),
       auVar34[6] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 9) == 'o'),
       auVar34[7] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 10) == 'n'),
       auVar34[8] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 0xb) == '-'),
       auVar34[9] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 0xc) == 'f'),
       auVar34[10] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xd) == 'a'),
       auVar34[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xe) == 'i'),
       auVar34[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xf) == 'l'),
       auVar34[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0x10) == 'u'),
       auVar34[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0x11) == 'r'),
       auVar34[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0x12) == 'e'),
       auVar22[0] = -(*(char *)local_248.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl == '-'
                     ),
       auVar22[1] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 1) == '-'),
       auVar22[2] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 2) == 'o'),
       auVar22[3] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 3) == 'u'),
       auVar22[4] = -(*(undefined1 *)
                       ((long)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4) ==
                     't'),
       auVar22[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 5) == 'p'),
       auVar22[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 6) == 'u'),
       auVar22[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 7) == 't'),
       auVar22[8] = -(*(char *)&(((string *)
                                 ((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 8))->_M_dataplus)._M_p == '-'),
       auVar22[9] = -(*(char *)((long)local_248.Impl._M_t.
                                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                               + 9) == 'o'),
       auVar22[10] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 10) == 'n'),
       auVar22[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xb) == '-'),
       auVar22[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xc) == 'f'),
       auVar22[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xd) == 'a'),
       auVar22[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xe) == 'i'),
       auVar22[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0xf) == 'l'), auVar22 = auVar22 & auVar34,
       (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff)) {
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->OutputTestOutputOnTestFailure
           = true;
      goto LAB_00534dfc;
    }
LAB_005343ab:
    varg1_04._M_str = "--show-only";
    varg1_04._M_len = (size_t)"-N";
    bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_04,pcVar11);
    if (bVar5) {
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ShowOnly = true;
      goto LAB_00534dfc;
    }
    local_1c8._0_8_ = local_240;
    local_1c8._8_8_ =
         local_248.Impl._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    __str_00._M_str = "--show-only=";
    __str_00._M_len = 0xc;
    pcVar11 = "--show-only=";
    iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,0,0xc,__str_00)
    ;
    if (iVar8 != 0) {
      varg1_05._M_str = "--output-log";
      varg1_05._M_len = (size_t)"-O";
      bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_05,pcVar11);
      if (bVar5) {
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
          sVar9 = *i + 1;
          *i = sVar9;
          SetOutputLogFileName(this,pbVar2 + sVar9);
          goto LAB_00534dfc;
        }
      }
      if (local_240 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x19) {
        auVar38[0] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 9) == 'e');
        auVar38[1] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 10) == 'w');
        auVar38[2] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xb) == '-');
        auVar38[3] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xc) == 'c');
        auVar38[4] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xd) == 't');
        auVar38[5] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xe) == 'e');
        auVar38[6] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0xf) == 's');
        auVar38[7] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x10) == 't');
        auVar38[8] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x11) == '-');
        auVar38[9] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 0x12) == 'p');
        auVar38[10] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 0x13) == 'r');
        auVar38[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0x14) == 'o');
        auVar38[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0x15) == 'c');
        auVar38[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0x16) == 'e');
        auVar38[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0x17) == 's');
        auVar38[0xf] = -(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)local_248.Impl._M_t.
                                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl +
                             0x18))->_M_local_buf[0] == 's');
        auVar25[0] = -(*(char *)local_248.Impl._M_t.
                                super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
                      '-');
        auVar25[1] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 1) == '-');
        auVar25[2] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 2) == 'f');
        auVar25[3] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 3) == 'o');
        auVar25[4] = -(*(undefined1 *)
                        ((long)local_248.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4)
                      == 'r');
        auVar25[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 5) == 'c');
        auVar25[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 6) == 'e');
        auVar25[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 7) == '-');
        auVar25[8] = -(*(char *)&(((string *)
                                  ((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 8))->_M_dataplus)._M_p == 'n');
        auVar25[9] = -(*(char *)((long)local_248.Impl._M_t.
                                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                       .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                       _M_head_impl + 9) == 'e');
        auVar25[10] = -(*(char *)((long)local_248.Impl._M_t.
                                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                        .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl + 10) == 'w');
        auVar25[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0xb) == '-');
        auVar25[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0xc) == 'c');
        auVar25[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0xd) == 't');
        auVar25[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0xe) == 'e');
        auVar25[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 0xf) == 's');
        auVar25 = auVar25 & auVar38;
        if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0053469b;
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ForceNewCTestProcess = true
        ;
      }
      else if ((local_240 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xe) &&
              (*(long *)((long)local_248.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 6)
               == 0x6761742d776f7272 &&
               *(long *)local_248.Impl._M_t.
                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                        .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
               0x72726f6d6f742d2d)) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TomorrowTag = true;
      }
      else {
LAB_0053469b:
        varg1_06._M_str = "--max-width";
        varg1_06._M_len = (size_t)"-W";
        bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_06,pcVar11);
        if (bVar5) {
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
            sVar9 = *i + 1;
            *i = sVar9;
            iVar8 = atoi(pbVar2[sVar9]._M_dataplus._M_p);
            ((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->MaxTestNameWidth =
                 iVar8;
            goto LAB_00534dfc;
          }
        }
        if (local_240 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0xb) {
          if (*(long *)((long)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 3) ==
              0x6574697277726576 &&
              *(long *)local_248.Impl._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
              0x72777265766f2d2d) {
            pbVar2 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (*i < ((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
              sVar9 = *i + 1;
              *i = sVar9;
              AddCTestConfigurationOverwrite(this,pbVar2 + sVar9);
              goto LAB_00534dfc;
            }
          }
        }
        else if (local_240 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xe) {
          if (*(long *)((long)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 6) ==
              0x7865646e692d7469 &&
              *(long *)local_248.Impl._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
              0x74696d6275732d2d) {
            pbVar2 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (*i < ((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
              sVar9 = *i + 1;
              *i = sVar9;
              iVar6 = atoi(pbVar2[sVar9]._M_dataplus._M_p);
              iVar8 = 0;
              if (0 < iVar6) {
                iVar8 = iVar6;
              }
              ((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->SubmitIndex = iVar8;
              goto LAB_00534dfc;
            }
          }
        }
        else if (local_240 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x18) {
          sVar1 = *(size_type *)
                   ((long)local_248.Impl._M_t.
                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                          .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x10);
          auVar39[0] = -((char)sVar1 == 'b');
          auVar39[1] = -((char)(sVar1 >> 8) == 'u');
          auVar39[2] = -((char)(sVar1 >> 0x10) == 'g');
          auVar39[3] = -((char)(sVar1 >> 0x18) == '-');
          auVar39[4] = -((char)(sVar1 >> 0x20) == 'm');
          auVar39[5] = -((char)(sVar1 >> 0x28) == 'o');
          auVar39[6] = -((char)(sVar1 >> 0x30) == 'd');
          auVar39[7] = -((char)(sVar1 >> 0x38) == 'e');
          auVar39[8] = 0xff;
          auVar39[9] = 0xff;
          auVar39[10] = 0xff;
          auVar39[0xb] = 0xff;
          auVar39[0xc] = 0xff;
          auVar39[0xd] = 0xff;
          auVar39[0xe] = 0xff;
          auVar39[0xf] = 0xff;
          auVar26[0] = -(*(char *)local_248.Impl._M_t.
                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
                        '-');
          auVar26[1] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 1) == '-');
          auVar26[2] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 2) == 'i');
          auVar26[3] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 3) == 'n');
          auVar26[4] = -(*(undefined1 *)
                          ((long)local_248.Impl._M_t.
                                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                 .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 4)
                        == 't');
          auVar26[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 5) == 'e');
          auVar26[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 6) == 'r');
          auVar26[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 7) == 'a');
          auVar26[8] = -(*(char *)&(((string *)
                                    ((long)local_248.Impl._M_t.
                                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                           .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                           _M_head_impl + 8))->_M_dataplus)._M_p == 'c');
          auVar26[9] = -(*(char *)((long)local_248.Impl._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl + 9) == 't');
          auVar26[10] = -(*(char *)((long)local_248.Impl._M_t.
                                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                          .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                          _M_head_impl + 10) == 'i');
          auVar26[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                           .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                           _M_head_impl + 0xb) == 'v');
          auVar26[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                           .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                           _M_head_impl + 0xc) == 'e');
          auVar26[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                           .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                           _M_head_impl + 0xd) == '-');
          auVar26[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                           .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                           _M_head_impl + 0xe) == 'd');
          auVar26[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                           .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                           _M_head_impl + 0xf) == 'e');
          auVar26 = auVar26 & auVar39;
          if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff) {
            pbVar2 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            value._M_str = (char *)(((long)(args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pbVar2 >> 5) - 1);
            if ((char *)*i < value._M_str) {
              pcVar11 = (char *)*i + 1;
              *i = (size_t)pcVar11;
              value._M_len = (size_t)pbVar2[(long)pcVar11]._M_dataplus._M_p;
              bVar5 = cmValue::IsOn((cmValue *)pbVar2[(long)pcVar11]._M_string_length,value);
              ((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->InteractiveDebugMode
                   = bVar5;
              goto LAB_00534dfc;
            }
          }
        }
        varg1_07._M_str = "--add-notes";
        varg1_07._M_len = (size_t)"-A";
        bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_07,pcVar11);
        if ((bVar5) &&
           (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
          local_1c8._0_8_ = &local_1b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Notes","");
          SetTest(this,(string *)local_1c8,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != &local_1b8) {
            operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
          }
          *i = *i + 1;
          bVar5 = true;
          std::__cxx11::string::_M_assign
                    ((string *)
                     &((this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->NotesFiles);
          goto LAB_0053583b;
        }
        if (local_240 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0xe) {
          if (*(long *)((long)local_248.Impl._M_t.
                              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                              .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 6) ==
              0x74696e756a2d7475 &&
              *(long *)local_248.Impl._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
              0x74757074756f2d2d) {
            pbVar2 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U <= *i)
            {
              pcVar11 = "\'--output-junit\' requires an argument";
              goto LAB_00533a27;
            }
            sVar9 = *i + 1;
            *i = sVar9;
            pcVar3 = pbVar2[sVar9]._M_dataplus._M_p;
            local_1c8._0_8_ = &local_1b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1c8,pcVar3,pcVar3 + pbVar2[sVar9]._M_string_length);
            cmCTestTestHandler::SetJUnitXMLFileName
                      (&((this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                        TestHandler,(string *)local_1c8);
            ((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->CompressTestOutput =
                 false;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._0_8_ != &local_1b8) goto LAB_00534a92;
          }
        }
        else if ((local_240 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0xa) &&
                (*(short *)&(((string *)
                             ((long)local_248.Impl._M_t.
                                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl +
                             8))->_M_dataplus)._M_p == 0x7269 &&
                 *(long *)local_248.Impl._M_t.
                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                          .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl ==
                 0x642d747365742d2d)) {
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U <= *i) {
            pcVar11 = "\'--test-dir\' requires an argument";
LAB_00533a27:
            std::__cxx11::string::operator=((string *)errormsg,pcVar11);
            goto LAB_005353fd;
          }
          sVar9 = *i + 1;
          *i = sVar9;
          pcVar3 = pbVar2[sVar9]._M_dataplus._M_p;
          local_1c8._0_8_ = &local_1b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1c8,pcVar3,pcVar3 + pbVar2[sVar9]._M_string_length);
          std::__cxx11::string::operator=
                    ((string *)
                     &((this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestDir,
                     (string *)local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != &local_1b8) {
LAB_00534a92:
            operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
          }
        }
      }
      goto LAB_00534dfc;
    }
    ((this->Impl)._M_t.
     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
     super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ShowOnly = true;
    local_1c8._0_8_ = &local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"--show-only=","");
    std::__cxx11::string::substr((ulong)local_228,(ulong)&local_248);
    iVar8 = std::__cxx11::string::compare(local_228);
    if (iVar8 == 0) {
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      (_Var4._M_head_impl)->Quiet = true;
      (_Var4._M_head_impl)->OutputAsJson = true;
      (_Var4._M_head_impl)->OutputAsJsonVersion = 1;
LAB_005347af:
      if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
        operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != &local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      goto LAB_00534dfc;
    }
    iVar8 = std::__cxx11::string::compare(local_228);
    if (iVar8 == 0) goto LAB_005347af;
    std::operator+(&local_50,"\'--show-only=\' given unknown value \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 == paVar14) {
      local_1f8._16_8_ = paVar14->_M_allocated_capacity;
      local_1f8._24_8_ = puVar10[3];
      local_1f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1f8 + 0x10);
    }
    else {
      local_1f8._16_8_ = paVar14->_M_allocated_capacity;
      local_1f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar10;
    }
    local_1f8._8_8_ = puVar10[1];
    *puVar10 = paVar14;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)errormsg,(string *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1f8 + 0x10)) {
      operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
    }
    uVar13 = local_1b8._M_allocated_capacity;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ != &local_1b8) goto LAB_005353f5;
LAB_005353fd:
    bVar5 = false;
    goto LAB_0053583b;
  }
  ((this->Impl)._M_t.super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
   ._M_t.super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
   super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Failover = true;
LAB_00534dfc:
  local_1c8._0_8_ = local_240;
  local_1c8._8_8_ =
       local_248.Impl._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  __str_01._M_str = "--no-tests=";
  __str_01._M_len = 0xb;
  pcVar11 = "--no-tests=";
  iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,0,0xb,__str_01);
  if (iVar8 == 0) {
    if (local_240 <
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xb) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",0xb)
      ;
    }
    __n = (undefined1 *)((long)local_240 + -0xb);
    __s1 = (void *)((long)local_248.Impl._M_t.
                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                          .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0xb);
    if (local_240 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&DAT_00000011) {
      iVar8 = bcmp(__s1,"ignore",(size_t)__n);
      if (iVar8 != 0) {
LAB_00535385:
        local_1c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x23;
        local_1c8._8_8_ = "\'--no-tests=\' given unknown value \'";
        local_228._8_8_ = local_228 + 0x10;
        local_228._0_8_ = (char *)0x1;
        local_228[0x10] = '\'';
        local_1a8 = (char *)0x1;
        views._M_len = 3;
        views._M_array = (iterator)local_1c8;
        local_1b8._M_allocated_capacity = (size_type)__n;
        local_1b8._8_8_ = __s1;
        local_1a0 = (pointer)local_228._8_8_;
        cmCatViews_abi_cxx11_((string *)local_1f8,views);
LAB_005353d3:
        std::__cxx11::string::operator=((string *)errormsg,(string *)local_1f8);
        uVar13 = local_1f8._16_8_;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1f8 + 0x10)) {
LAB_005353f5:
          operator_delete(paVar14,(ulong)(uVar13 + 1));
        }
        goto LAB_005353fd;
      }
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->NoTestsMode = Ignore;
    }
    else {
      if ((local_240 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x10) || (iVar8 = bcmp(__s1,"error",(size_t)__n), iVar8 != 0)) goto LAB_00535385;
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->NoTestsMode = Error;
    }
  }
  else {
    varg1_08._M_str = "--tests-information";
    varg1_08._M_len = (size_t)"-I";
    bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_08,pcVar11);
    if ((bVar5) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      *i = *i + 1;
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"TestsToRunInformation","");
      cmCTestGenericHandler::SetPersistentOption
                (&((_Var4._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                 (string *)local_1c8,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != &local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"TestsToRunInformation","");
      cmCTestGenericHandler::SetPersistentOption
                ((cmCTestGenericHandler *)&(_Var4._M_head_impl)->MemCheckHandler,(string *)local_1c8
                 ,(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
LAB_0053581b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ == &local_1b8) goto LAB_00535838;
    }
    else {
      varg1_09._M_str = "--union";
      varg1_09._M_len = (size_t)"-U";
      bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_09,pcVar11);
      if (!bVar5) {
        varg1_10._M_str = "--tests-regex";
        varg1_10._M_len = (size_t)"-R";
        bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_10,pcVar11);
        if ((bVar5) &&
           (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
          *i = *i + 1;
          _Var4._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          local_1c8._0_8_ = &local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"IncludeRegularExpression","");
          cmCTestGenericHandler::SetPersistentOption
                    (&((_Var4._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                     (string *)local_1c8,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != &local_1b8) {
            operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
          }
          _Var4._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          local_1c8._0_8_ = &local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"IncludeRegularExpression","");
          cmCTestGenericHandler::SetPersistentOption
                    ((cmCTestGenericHandler *)&(_Var4._M_head_impl)->MemCheckHandler,
                     (string *)local_1c8,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
        }
        else {
          varg1_11._M_str = "--label-regex";
          varg1_11._M_len = (size_t)"-L";
          bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_11,pcVar11);
          if ((bVar5) &&
             (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
            *i = *i + 1;
            _Var4._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            local_1c8._0_8_ = &local_1b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"LabelRegularExpression","");
            cmCTestGenericHandler::AddPersistentMultiOption
                      (&((_Var4._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                       (string *)local_1c8,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + *i);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._0_8_ != &local_1b8) {
              operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
            }
            _Var4._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            local_1c8._0_8_ = &local_1b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"LabelRegularExpression","");
            cmCTestGenericHandler::AddPersistentMultiOption
                      ((cmCTestGenericHandler *)&(_Var4._M_head_impl)->MemCheckHandler,
                       (string *)local_1c8,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + *i);
          }
          else {
            varg1_12._M_str = "--label-exclude";
            varg1_12._M_len = (size_t)"-LE";
            bVar5 = CheckArgument(&local_248,(string *)0x3,varg1_12,pcVar11);
            if ((bVar5) &&
               (*i < ((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
              *i = *i + 1;
              _Var4._M_head_impl =
                   (this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
              local_1c8._0_8_ = &local_1b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"ExcludeLabelRegularExpression","");
              cmCTestGenericHandler::AddPersistentMultiOption
                        (&((_Var4._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                         (string *)local_1c8,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + *i);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._0_8_ != &local_1b8) {
                operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1)
                               );
              }
              _Var4._M_head_impl =
                   (this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
              local_1c8._0_8_ = &local_1b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"ExcludeLabelRegularExpression","");
              cmCTestGenericHandler::AddPersistentMultiOption
                        ((cmCTestGenericHandler *)&(_Var4._M_head_impl)->MemCheckHandler,
                         (string *)local_1c8,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + *i);
            }
            else {
              varg1_13._M_str = "--exclude-regex";
              varg1_13._M_len = (size_t)"-E";
              bVar5 = CheckArgument(&local_248,(string *)0x2,varg1_13,pcVar11);
              if ((bVar5) &&
                 (*i < ((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                *i = *i + 1;
                _Var4._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                local_1c8._0_8_ = &local_1b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c8,"ExcludeRegularExpression","");
                cmCTestGenericHandler::SetPersistentOption
                          (&((_Var4._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                           (string *)local_1c8,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._0_8_ != &local_1b8) {
                  operator_delete((void *)local_1c8._0_8_,
                                  (ulong)(local_1b8._M_allocated_capacity + 1));
                }
                _Var4._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                local_1c8._0_8_ = &local_1b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c8,"ExcludeRegularExpression","");
                cmCTestGenericHandler::SetPersistentOption
                          ((cmCTestGenericHandler *)&(_Var4._M_head_impl)->MemCheckHandler,
                           (string *)local_1c8,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
              }
              else {
                varg1_14._M_str = "--fixture-exclude-any";
                varg1_14._M_len = (size_t)"-FA";
                bVar5 = CheckArgument(&local_248,(string *)0x3,varg1_14,pcVar11);
                if ((bVar5) &&
                   (*i < ((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                  *i = *i + 1;
                  _Var4._M_head_impl =
                       (this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                  local_1c8._0_8_ = &local_1b8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1c8,"ExcludeFixtureRegularExpression","");
                  cmCTestGenericHandler::SetPersistentOption
                            (&((_Var4._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                             (string *)local_1c8,
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._0_8_ != &local_1b8) {
                    operator_delete((void *)local_1c8._0_8_,
                                    (ulong)(local_1b8._M_allocated_capacity + 1));
                  }
                  _Var4._M_head_impl =
                       (this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                  local_1c8._0_8_ = &local_1b8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1c8,"ExcludeFixtureRegularExpression","");
                  cmCTestGenericHandler::SetPersistentOption
                            ((cmCTestGenericHandler *)&(_Var4._M_head_impl)->MemCheckHandler,
                             (string *)local_1c8,
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                }
                else {
                  varg1_15._M_str = "--fixture-exclude-setup";
                  varg1_15._M_len = (size_t)"-FS";
                  bVar5 = CheckArgument(&local_248,(string *)0x3,varg1_15,pcVar11);
                  if ((bVar5) &&
                     (*i < ((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                    *i = *i + 1;
                    _Var4._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    local_1c8._0_8_ = &local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1c8,"ExcludeFixtureSetupRegularExpression","");
                    cmCTestGenericHandler::SetPersistentOption
                              (&((_Var4._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                               (string *)local_1c8,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._0_8_ != &local_1b8) {
                      operator_delete((void *)local_1c8._0_8_,
                                      (ulong)(local_1b8._M_allocated_capacity + 1));
                    }
                    _Var4._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    local_1c8._0_8_ = &local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1c8,"ExcludeFixtureSetupRegularExpression","");
                    cmCTestGenericHandler::SetPersistentOption
                              ((cmCTestGenericHandler *)&(_Var4._M_head_impl)->MemCheckHandler,
                               (string *)local_1c8,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                  }
                  else {
                    varg1_16._M_str = "--fixture-exclude-cleanup";
                    varg1_16._M_len = (size_t)"-FC";
                    bVar5 = CheckArgument(&local_248,(string *)0x3,varg1_16,pcVar11);
                    if ((!bVar5) ||
                       (((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= *i)) {
                      bVar5 = true;
                      if (local_240 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0xe) {
                        if (*(long *)((long)local_248.Impl._M_t.
                                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                            .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                            _M_head_impl + 6) == 0x64656c6961662d6e &&
                            *(long *)local_248.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl
                            == 0x2d6e757265722d2d) {
                          _Var4._M_head_impl =
                               (this->Impl)._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                          local_1c8._0_8_ = &local_1b8;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_1c8,"RerunFailed","");
                          cmCTestGenericHandler::SetPersistentOption
                                    (&((_Var4._M_head_impl)->TestHandler).
                                      super_cmCTestGenericHandler,(string *)local_1c8,"true");
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1c8._0_8_ != &local_1b8) {
                            operator_delete((void *)local_1c8._0_8_,
                                            (ulong)(local_1b8._M_allocated_capacity + 1));
                          }
                          _Var4._M_head_impl =
                               (this->Impl)._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                          local_1c8._0_8_ = &local_1b8;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_1c8,"RerunFailed","");
                          cmCTestGenericHandler::SetPersistentOption
                                    ((cmCTestGenericHandler *)&(_Var4._M_head_impl)->MemCheckHandler
                                     ,(string *)local_1c8,"true");
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1c8._0_8_ != &local_1b8) {
                            operator_delete((void *)local_1c8._0_8_,
                                            (ulong)(local_1b8._M_allocated_capacity + 1));
                          }
                        }
                      }
                      else if (local_240 ==
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)&DAT_00000014) {
                        iVar8 = *(int *)((long)local_248.Impl._M_t.
                                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                               .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                               _M_head_impl + 0x10);
                        auVar40[0] = -((char)iVar8 == 'f');
                        auVar40[1] = -((char)((uint)iVar8 >> 8) == 'i');
                        auVar40[2] = -((char)((uint)iVar8 >> 0x10) == 'l');
                        auVar40[3] = -((char)((uint)iVar8 >> 0x18) == 'e');
                        auVar40[4] = 0xff;
                        auVar40[5] = 0xff;
                        auVar40[6] = 0xff;
                        auVar40[7] = 0xff;
                        auVar40[8] = 0xff;
                        auVar40[9] = 0xff;
                        auVar40[10] = 0xff;
                        auVar40[0xb] = 0xff;
                        auVar40[0xc] = 0xff;
                        auVar40[0xd] = 0xff;
                        auVar40[0xe] = 0xff;
                        auVar40[0xf] = 0xff;
                        auVar27[0] = -(*(char *)local_248.Impl._M_t.
                                                super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                _M_head_impl == '-');
                        auVar27[1] = -(*(char *)((long)local_248.Impl._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 1) == '-');
                        auVar27[2] = -(*(char *)((long)local_248.Impl._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 2) == 'r');
                        auVar27[3] = -(*(char *)((long)local_248.Impl._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 3) == 'e');
                        auVar27[4] = -(*(undefined1 *)
                                        ((long)local_248.Impl._M_t.
                                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                               .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                               _M_head_impl + 4) == 's');
                        auVar27[5] = -(*(byte *)((long)local_248.Impl._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 5) == 'o');
                        auVar27[6] = -(*(byte *)((long)local_248.Impl._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 6) == 'u');
                        auVar27[7] = -(*(byte *)((long)local_248.Impl._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 7) == 'r');
                        auVar27[8] = -(*(char *)&(((string *)
                                                  ((long)local_248.Impl._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 8))->_M_dataplus)._M_p == 'c');
                        auVar27[9] = -(*(char *)((long)local_248.Impl._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 9) == 'e');
                        auVar27[10] = -(*(char *)((long)local_248.Impl._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 10) == '-');
                        auVar27[0xb] = -(*(char *)((long)local_248.Impl._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 0xb) == 's');
                        auVar27[0xc] = -(*(char *)((long)local_248.Impl._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 0xc) == 'p');
                        auVar27[0xd] = -(*(char *)((long)local_248.Impl._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 0xd) == 'e');
                        auVar27[0xe] = -(*(char *)((long)local_248.Impl._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 0xe) == 'c');
                        auVar27[0xf] = -(*(char *)((long)local_248.Impl._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl + 0xf) == '-');
                        auVar27 = auVar27 & auVar40;
                        if (((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff) &&
                           (*i < ((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                          *i = *i + 1;
                          _Var4._M_head_impl =
                               (this->Impl)._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                          local_1c8._0_8_ = &local_1b8;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_1c8,"ResourceSpecFile","");
                          cmCTestGenericHandler::SetPersistentOption
                                    (&((_Var4._M_head_impl)->TestHandler).
                                      super_cmCTestGenericHandler,(string *)local_1c8,
                                     (args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p
                                    );
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1c8._0_8_ != &local_1b8) {
                            operator_delete((void *)local_1c8._0_8_,
                                            (ulong)(local_1b8._M_allocated_capacity + 1));
                          }
                          _Var4._M_head_impl =
                               (this->Impl)._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                          local_1c8._0_8_ = &local_1b8;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_1c8,"ResourceSpecFile","");
                          cmCTestGenericHandler::SetPersistentOption
                                    ((cmCTestGenericHandler *)&(_Var4._M_head_impl)->MemCheckHandler
                                     ,(string *)local_1c8,
                                     (args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p
                                    );
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1c8._0_8_ != &local_1b8) {
                            operator_delete((void *)local_1c8._0_8_,
                                            (ulong)(local_1b8._M_allocated_capacity + 1));
                          }
                        }
                      }
                      goto LAB_0053583b;
                    }
                    *i = *i + 1;
                    _Var4._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    local_1c8._0_8_ = &local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1c8,"ExcludeFixtureCleanupRegularExpression","");
                    cmCTestGenericHandler::SetPersistentOption
                              (&((_Var4._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                               (string *)local_1c8,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._0_8_ != &local_1b8) {
                      operator_delete((void *)local_1c8._0_8_,
                                      (ulong)(local_1b8._M_allocated_capacity + 1));
                    }
                    _Var4._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    local_1c8._0_8_ = &local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1c8,"ExcludeFixtureCleanupRegularExpression","");
                    cmCTestGenericHandler::SetPersistentOption
                              ((cmCTestGenericHandler *)&(_Var4._M_head_impl)->MemCheckHandler,
                               (string *)local_1c8,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                  }
                }
              }
            }
          }
        }
        goto LAB_0053581b;
      }
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"UseUnion","");
      cmCTestGenericHandler::SetPersistentOption
                (&((_Var4._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                 (string *)local_1c8,"true");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != &local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"UseUnion","");
      cmCTestGenericHandler::SetPersistentOption
                ((cmCTestGenericHandler *)&(_Var4._M_head_impl)->MemCheckHandler,(string *)local_1c8
                 ,"true");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ == &local_1b8) goto LAB_00535838;
    }
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
  }
LAB_00535838:
  bVar5 = true;
LAB_0053583b:
  if (local_248.Impl._M_t.
      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
      super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl !=
      (unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>)local_238) {
    operator_delete((void *)local_248.Impl._M_t.
                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                            .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                    local_238[0] + 1);
  }
  return bVar5;
}

Assistant:

bool cmCTest::HandleCommandLineArguments(size_t& i,
                                         std::vector<std::string>& args,
                                         std::string& errormsg)
{
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-F"_s)) {
    this->Impl->Failover = true;
  } else if (this->CheckArgument(arg, "-j"_s, "--parallel") &&
             i < args.size() - 1) {
    i++;
    int plevel = atoi(args[i].c_str());
    this->SetParallelLevel(plevel);
    this->Impl->ParallelLevelSetInCli = true;
  } else if (cmHasPrefix(arg, "-j")) {
    int plevel = atoi(arg.substr(2).c_str());
    this->SetParallelLevel(plevel);
    this->Impl->ParallelLevelSetInCli = true;
  }

  else if (this->CheckArgument(arg, "--repeat-until-fail"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--repeat-until-fail' requires an argument";
      return false;
    }
    if (this->Impl->RepeatMode != cmCTest::Repeat::Never) {
      errormsg = "At most one '--repeat' option may be used.";
      return false;
    }
    i++;
    long repeat = 1;
    if (!cmStrToLong(args[i], &repeat)) {
      errormsg = cmStrCat("'--repeat-until-fail' given non-integer value '",
                          args[i], "'");
      return false;
    }
    this->Impl->RepeatCount = static_cast<int>(repeat);
    if (repeat > 1) {
      this->Impl->RepeatMode = cmCTest::Repeat::UntilFail;
    }
  }

  else if (this->CheckArgument(arg, "--repeat"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--repeat' requires an argument";
      return false;
    }
    if (this->Impl->RepeatMode != cmCTest::Repeat::Never) {
      errormsg = "At most one '--repeat' option may be used.";
      return false;
    }
    i++;
    cmsys::RegularExpression repeatRegex(
      "^(until-fail|until-pass|after-timeout):([0-9]+)$");
    if (repeatRegex.find(args[i])) {
      std::string const& count = repeatRegex.match(2);
      unsigned long n = 1;
      cmStrToULong(count, &n); // regex guarantees success
      this->Impl->RepeatCount = static_cast<int>(n);
      if (this->Impl->RepeatCount > 1) {
        std::string const& mode = repeatRegex.match(1);
        if (mode == "until-fail") {
          this->Impl->RepeatMode = cmCTest::Repeat::UntilFail;
        } else if (mode == "until-pass") {
          this->Impl->RepeatMode = cmCTest::Repeat::UntilPass;
        } else if (mode == "after-timeout") {
          this->Impl->RepeatMode = cmCTest::Repeat::AfterTimeout;
        }
      }
    } else {
      errormsg = cmStrCat("'--repeat' given invalid value '", args[i], "'");
      return false;
    }
  }

  else if (this->CheckArgument(arg, "--test-load"_s) && i < args.size() - 1) {
    i++;
    unsigned long load;
    if (cmStrToULong(args[i], &load)) {
      this->SetTestLoad(load);
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for 'Test Load' : " << args[i] << std::endl);
    }
  }

  else if (this->CheckArgument(arg, "--no-compress-output"_s)) {
    this->Impl->CompressTestOutput = false;
  }

  else if (this->CheckArgument(arg, "--print-labels"_s)) {
    this->Impl->PrintLabels = true;
  }

  else if (this->CheckArgument(arg, "--http1.0"_s)) {
    this->Impl->UseHTTP10 = true;
  }

  else if (this->CheckArgument(arg, "--timeout"_s) && i < args.size() - 1) {
    i++;
    auto timeout = cmDuration(atof(args[i].c_str()));
    this->Impl->GlobalTimeout = timeout;
  }

  else if (this->CheckArgument(arg, "--stop-time"_s) && i < args.size() - 1) {
    i++;
    this->SetStopTime(args[i]);
  }

  else if (this->CheckArgument(arg, "--stop-on-failure"_s)) {
    this->Impl->StopOnFailure = true;
  }

  else if (this->CheckArgument(arg, "-C"_s, "--build-config") &&
           i < args.size() - 1) {
    i++;
    this->SetConfigType(args[i]);
  }

  else if (this->CheckArgument(arg, "--debug"_s)) {
    this->Impl->Debug = true;
    this->Impl->ShowLineNumbers = true;
  } else if ((this->CheckArgument(arg, "--group"_s) ||
              // This is an undocumented / deprecated option.
              // "Track" has been renamed to "Group".
              this->CheckArgument(arg, "--track"_s)) &&
             i < args.size() - 1) {
    i++;
    this->Impl->SpecificGroup = args[i];
  } else if (this->CheckArgument(arg, "--show-line-numbers"_s)) {
    this->Impl->ShowLineNumbers = true;
  } else if (this->CheckArgument(arg, "--no-label-summary"_s)) {
    this->Impl->LabelSummary = false;
  } else if (this->CheckArgument(arg, "--no-subproject-summary"_s)) {
    this->Impl->SubprojectSummary = false;
  } else if (this->CheckArgument(arg, "-Q"_s, "--quiet")) {
    this->Impl->Quiet = true;
  } else if (this->CheckArgument(arg, "--progress"_s)) {
    this->Impl->TestProgressOutput = true;
  } else if (this->CheckArgument(arg, "-V"_s, "--verbose")) {
    this->Impl->Verbose = true;
  } else if (this->CheckArgument(arg, "-VV"_s, "--extra-verbose")) {
    this->Impl->ExtraVerbose = true;
    this->Impl->Verbose = true;
  } else if (this->CheckArgument(arg, "--output-on-failure"_s)) {
    this->Impl->OutputTestOutputOnTestFailure = true;
  } else if (this->CheckArgument(arg, "--test-output-size-passed"_s) &&
             i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmStrToLong(args[i], &outputSize)) {
      this->Impl->TestHandler.SetTestOutputSizePassed(
        static_cast<int>(outputSize));
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-passed': " << args[i]
                                                                   << "\n");
    }
  } else if (this->CheckArgument(arg, "--test-output-size-failed"_s) &&
             i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmStrToLong(args[i], &outputSize)) {
      this->Impl->TestHandler.SetTestOutputSizeFailed(
        static_cast<int>(outputSize));
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-failed': " << args[i]
                                                                   << "\n");
    }
  } else if (this->CheckArgument(arg, "--test-output-truncation"_s) &&
             i < args.size() - 1) {
    i++;
    if (!this->Impl->TestHandler.SetTestOutputTruncation(args[i])) {
      errormsg = "Invalid value for '--test-output-truncation': " + args[i];
      return false;
    }
  } else if (this->CheckArgument(arg, "-N"_s, "--show-only")) {
    this->Impl->ShowOnly = true;
  } else if (cmHasLiteralPrefix(arg, "--show-only=")) {
    this->Impl->ShowOnly = true;

    // Check if a specific format is requested. Defaults to human readable
    // text.
    std::string argWithFormat = "--show-only=";
    std::string format = arg.substr(argWithFormat.length());
    if (format == "json-v1") {
      // Force quiet mode so the only output is the json object model.
      this->Impl->Quiet = true;
      this->Impl->OutputAsJson = true;
      this->Impl->OutputAsJsonVersion = 1;
    } else if (format != "human") {
      errormsg = "'--show-only=' given unknown value '" + format + "'";
      return false;
    }
  }

  else if (this->CheckArgument(arg, "-O"_s, "--output-log") &&
           i < args.size() - 1) {
    i++;
    this->SetOutputLogFileName(args[i]);
  }

  else if (this->CheckArgument(arg, "--tomorrow-tag"_s)) {
    this->Impl->TomorrowTag = true;
  } else if (this->CheckArgument(arg, "--force-new-ctest-process"_s)) {
    this->Impl->ForceNewCTestProcess = true;
  } else if (this->CheckArgument(arg, "-W"_s, "--max-width") &&
             i < args.size() - 1) {
    i++;
    this->Impl->MaxTestNameWidth = atoi(args[i].c_str());
  } else if (this->CheckArgument(arg, "--interactive-debug-mode"_s) &&
             i < args.size() - 1) {
    i++;
    this->Impl->InteractiveDebugMode = cmIsOn(args[i]);
  } else if (this->CheckArgument(arg, "--submit-index"_s) &&
             i < args.size() - 1) {
    i++;
    this->Impl->SubmitIndex = atoi(args[i].c_str());
    if (this->Impl->SubmitIndex < 0) {
      this->Impl->SubmitIndex = 0;
    }
  }

  else if (this->CheckArgument(arg, "--overwrite"_s) && i < args.size() - 1) {
    i++;
    this->AddCTestConfigurationOverwrite(args[i]);
  } else if (this->CheckArgument(arg, "-A"_s, "--add-notes") &&
             i < args.size() - 1) {
    this->Impl->ProduceXML = true;
    this->SetTest("Notes");
    i++;
    this->SetNotesFiles(args[i]);
    return true;
  } else if (this->CheckArgument(arg, "--test-dir"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--test-dir' requires an argument";
      return false;
    }
    i++;
    this->Impl->TestDir = std::string(args[i]);
  } else if (this->CheckArgument(arg, "--output-junit"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--output-junit' requires an argument";
      return false;
    }
    i++;
    this->SetOutputJUnitFileName(std::string(args[i]));
  }

  cm::string_view noTestsPrefix = "--no-tests=";
  if (cmHasPrefix(arg, noTestsPrefix)) {
    cm::string_view noTestsMode =
      cm::string_view(arg).substr(noTestsPrefix.length());
    if (noTestsMode == "error") {
      this->Impl->NoTestsMode = cmCTest::NoTests::Error;
    } else if (noTestsMode != "ignore") {
      errormsg =
        cmStrCat("'--no-tests=' given unknown value '", noTestsMode, '\'');
      return false;
    } else {
      this->Impl->NoTestsMode = cmCTest::NoTests::Ignore;
    }
  }

  // options that control what tests are run
  else if (this->CheckArgument(arg, "-I"_s, "--tests-information") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("TestsToRunInformation",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("TestsToRunInformation",
                                                    args[i].c_str());
  } else if (this->CheckArgument(arg, "-U"_s, "--union")) {
    this->GetTestHandler()->SetPersistentOption("UseUnion", "true");
    this->GetMemCheckHandler()->SetPersistentOption("UseUnion", "true");
  } else if (this->CheckArgument(arg, "-R"_s, "--tests-regex") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("IncludeRegularExpression",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("IncludeRegularExpression",
                                                    args[i].c_str());
  } else if (this->CheckArgument(arg, "-L"_s, "--label-regex") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->AddPersistentMultiOption("LabelRegularExpression",
                                                     args[i]);
    this->GetMemCheckHandler()->AddPersistentMultiOption(
      "LabelRegularExpression", args[i]);
  } else if (this->CheckArgument(arg, "-LE"_s, "--label-exclude") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->AddPersistentMultiOption(
      "ExcludeLabelRegularExpression", args[i]);
    this->GetMemCheckHandler()->AddPersistentMultiOption(
      "ExcludeLabelRegularExpression", args[i]);
  }

  else if (this->CheckArgument(arg, "-E"_s, "--exclude-regex") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("ExcludeRegularExpression",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("ExcludeRegularExpression",
                                                    args[i].c_str());
  }

  else if (this->CheckArgument(arg, "-FA"_s, "--fixture-exclude-any") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureRegularExpression", args[i].c_str());
  } else if (this->CheckArgument(arg, "-FS"_s, "--fixture-exclude-setup") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureSetupRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureSetupRegularExpression", args[i].c_str());
  } else if (this->CheckArgument(arg, "-FC"_s, "--fixture-exclude-cleanup") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureCleanupRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureCleanupRegularExpression", args[i].c_str());
  }

  else if (this->CheckArgument(arg, "--resource-spec-file"_s) &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("ResourceSpecFile",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("ResourceSpecFile",
                                                    args[i].c_str());
  }

  else if (this->CheckArgument(arg, "--rerun-failed"_s)) {
    this->GetTestHandler()->SetPersistentOption("RerunFailed", "true");
    this->GetMemCheckHandler()->SetPersistentOption("RerunFailed", "true");
  }
  return true;
}